

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

int Cba_StrCmpInt(char *p1,char *p2,int i)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  cVar1 = p1[i];
  if ((((byte)(cVar1 - 0x3aU) < 0xf6) && ((byte)(p2[i] - 0x3aU) < 0xf6)) ||
     (((uVar5 = (ulong)(uint)i, i < 1 || ((byte)(p1[uVar5 - 1] - 0x3aU) < 0xf6)) &&
      (((byte)(cVar1 - 0x3aU) < 0xf6 || ((byte)(p2[i] - 0x3aU) < 0xf6)))))) {
    iVar2 = -1;
    if ((p2[i] <= cVar1) && (iVar2 = 1, cVar1 <= p2[i])) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                    ,0x19e,"int Cba_StrCmpInt(char *, char *, int)");
    }
  }
  else {
    uVar6 = i >> 0x1f & i;
    do {
      uVar5 = uVar5 - 1;
      uVar7 = uVar6;
      uVar8 = uVar6 - 1;
      if (i < 1) break;
      uVar8 = i - 1;
      uVar7 = i;
      i = uVar8;
    } while (0xf5 < (byte)(p1[uVar5 & 0xffffffff] - 0x3aU));
    if ((byte)(p1[(int)uVar7] - 0x3aU) < 0xf6) {
      __assert_fail("Cba_CharIsDigit(p1[i])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                    ,0x189,"int Cba_StrCmpInt(char *, char *, int)");
    }
    if ((byte)(p2[(int)uVar7] - 0x3aU) < 0xf6) {
      __assert_fail("Cba_CharIsDigit(p2[i])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                    ,0x18a,"int Cba_StrCmpInt(char *, char *, int)");
    }
    if (uVar7 != 0) {
      if (0xf5 < (byte)(p1[(int)uVar8] - 0x3aU)) {
        __assert_fail("i == 0 || !Cba_CharIsDigit(p1[i-1])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                      ,0x18c,"int Cba_StrCmpInt(char *, char *, int)");
      }
      if (0xf5 < (byte)(p2[(int)uVar8] - 0x3aU)) {
        __assert_fail("i == 0 || !Cba_CharIsDigit(p2[i-1])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                      ,0x18d,"int Cba_StrCmpInt(char *, char *, int)");
      }
    }
    iVar3 = atoi(p1 + (int)uVar7);
    iVar4 = atoi(p2 + (int)uVar7);
    iVar2 = -1;
    if ((iVar4 <= iVar3) && (iVar2 = 1, iVar3 <= iVar4)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                    ,0x195,"int Cba_StrCmpInt(char *, char *, int)");
    }
  }
  return iVar2;
}

Assistant:

int Cba_StrCmpInt( char * p1, char * p2, int i )
{
    // check if one of the mismatching chars is a digit
    if ( Cba_CharIsDigit(p1[i]) || Cba_CharIsDigit(p2[i]) )
    {
        // if previous (equal) char was a digit or if this is first digit on both sides, scroll back
        if ( (i > 0 && Cba_CharIsDigit(p1[i-1])) || (Cba_CharIsDigit(p1[i]) && Cba_CharIsDigit(p2[i])) )
        {
            int Num1, Num2;
            // find the first digit
            for ( --i; i >= 0; i-- )
                if ( !Cba_CharIsDigit(p1[i]) )
                    break;
            i++;
            // current char is digit
            assert( Cba_CharIsDigit(p1[i]) );
            assert( Cba_CharIsDigit(p2[i]) );
            // previous char does not exist or is not a digit
            assert( i == 0 || !Cba_CharIsDigit(p1[i-1]) );
            assert( i == 0 || !Cba_CharIsDigit(p2[i-1]) );
            // compare numbers
            Num1 = atoi( p1 + i );
            Num2 = atoi( p2 + i );
            if ( Num1 < Num2 )
                return -1;
            if ( Num1 > Num2 ) 
                return 1;
            assert( 0 );
            return 0;
        }
    }
    // compare as usual
    if ( p1[i] < p2[i] )
        return -1;
    if ( p1[i] > p2[i] )
        return 1;
    assert( 0 );
    return 0;
}